

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 float64_muladd_arm(float64 xa,float64 xb,float64 xc,int flags,float_status *s)

{
  int iVar1;
  float64 fVar2;
  double __z;
  double __x;
  bool bVar3;
  double dVar4;
  
  if ((s->float_exception_flags & 0x20) == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = s->float_rounding_mode == '\0';
  }
  if (((flags & 8U) == 0) && (bVar3)) {
    if (s->flush_inputs_to_zero != '\0') {
      if ((xa & 0x7fffffffffffffff) != 0 && (xa & 0x7ff0000000000000) == 0) {
        xa = xa & 0x8000000000000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((xb & 0x7fffffffffffffff) != 0 && (xb & 0x7ff0000000000000) == 0) {
        xb = xb & 0x8000000000000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((xc & 0x7fffffffffffffff) != 0 && (xc & 0x7ff0000000000000) == 0) {
        xc = xc & 0x8000000000000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
    }
    iVar1 = __fpclassify((double)xa);
    if ((iVar1 == 4) || (iVar1 == 2)) {
      iVar1 = __fpclassify((double)xb);
      if ((iVar1 == 4) || (iVar1 == 2)) {
        iVar1 = __fpclassify((double)xc);
        if ((iVar1 == 4) || (iVar1 == 2)) {
          if ((ABS((double)xa) == 0.0) || (ABS((double)xb) == 0.0)) {
            if (SUB41((flags & 2U) >> 1,0) == (long)(xb ^ xa) < 0) {
              dVar4 = 0.0;
            }
            else {
              dVar4 = -0.0;
            }
            if ((flags & 1U) != 0) {
              xc = (float64)-(double)xc;
            }
            dVar4 = (double)xc + dVar4;
          }
          else {
            __x = -(double)xa;
            if ((flags & 2U) == 0) {
              __x = (double)xa;
            }
            __z = -(double)xc;
            if ((flags & 1U) == 0) {
              __z = (double)xc;
            }
            dVar4 = fma(__x,(double)xb,__z);
            if (ABS(dVar4) == INFINITY) {
              s->float_exception_flags = s->float_exception_flags | 8;
              bVar3 = true;
            }
            else {
              bVar3 = true;
              if (ABS(dVar4) <= 1.1754943508222875e-38) {
                bVar3 = false;
                __z = (double)xc;
                __x = (double)xa;
              }
            }
            xa = (float64)__x;
            xc = (float64)__z;
            if (!bVar3) goto LAB_00491997;
          }
          if ((flags & 4U) != 0) {
            dVar4 = (double)((ulong)dVar4 ^ (ulong)DAT_00d63000);
          }
          return (float64)dVar4;
        }
      }
    }
  }
LAB_00491997:
  fVar2 = soft_f64_muladd(xa,xb,xc,flags,s);
  return fVar2;
}

Assistant:

float64 QEMU_FLATTEN
float64_muladd(float64 xa, float64 xb, float64 xc, int flags, float_status *s)
{
    union_float64 ua, ub, uc, ur;

    ua.s = xa;
    ub.s = xb;
    uc.s = xc;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }
    if (unlikely(flags & float_muladd_halve_result)) {
        goto soft;
    }

    float64_input_flush3(&ua.s, &ub.s, &uc.s, s);
    if (unlikely(!f64_is_zon3(ua, ub, uc))) {
        goto soft;
    }

    if (unlikely(force_soft_fma)) {
        goto soft;
    }

    /*
     * When (a || b) == 0, there's no need to check for under/over flow,
     * since we know the addend is (normal || 0) and the product is 0.
     */
    if (float64_is_zero(ua.s) || float64_is_zero(ub.s)) {
        union_float64 up;
        bool prod_sign;

        prod_sign = float64_is_neg(ua.s) ^ float64_is_neg(ub.s);
        prod_sign ^= !!(flags & float_muladd_negate_product);
        up.s = float64_set_sign(float64_zero, prod_sign);

        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }
        ur.h = up.h + uc.h;
    } else {
        union_float64 ua_orig = ua;
        union_float64 uc_orig = uc;

        if (flags & float_muladd_negate_product) {
            ua.h = -ua.h;
        }
        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }

        ur.h = fma(ua.h, ub.h, uc.h);

        if (unlikely(f64_is_inf(ur))) {
            s->float_exception_flags |= float_flag_overflow;
        } else if (unlikely(fabs(ur.h) <= FLT_MIN)) {
            ua = ua_orig;
            uc = uc_orig;
            goto soft;
        }
    }
    if (flags & float_muladd_negate_result) {
        return float64_chs(ur.s);
    }
    return ur.s;

 soft:
    return soft_f64_muladd(ua.s, ub.s, uc.s, flags, s);
}